

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeFlushCase::testBufferUpload
          (MapBufferRangeFlushCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar4;
  deUint64 dVar5;
  void *dst;
  undefined8 *puVar6;
  Exception *this_00;
  TestError *this_01;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  string local_60;
  long local_40;
  deUint64 local_38;
  long lVar3;
  
  if (3 < this->m_unmapFailures) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Unmapping failures exceeded limit","");
    tcu::TestError::TestError(this_01,&local_60);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = bufferSize + 3;
  if (-1 < bufferSize) {
    iVar9 = bufferSize;
  }
  iVar2 = (*((this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = bufferSize / 2;
  if (this->m_fullUpload != false) {
    iVar2 = bufferSize;
  }
  if ((this->m_fullUpload != true) || (iVar8 = bufferSize, this->m_flushPartial == true)) {
    iVar8 = bufferSize / 2;
  }
  result->writtenSize = iVar8;
  (**(code **)(lVar3 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                    .m_bufferID);
  if (this->m_useUnusedUnspecifiedBuffer == true) {
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,(long)bufferSize,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_bufferUsage);
  }
  else {
    if (this->m_useUnusedSpecifiedBuffer != true) {
      dVar5 = 0;
      goto LAB_01325cbd;
    }
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,(long)bufferSize,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_bufferUsage);
  }
  dVar5 = deGetMicroseconds();
  dVar5 = dVar5 - dVar4;
LAB_01325cbd:
  (result->duration).allocDuration = dVar5;
  dVar5 = deGetMicroseconds();
  lVar7 = (long)(iVar9 >> 2);
  if (this->m_fullUpload != false) {
    lVar7 = 0;
  }
  lVar10 = (long)iVar2;
  dst = (void *)(**(code **)(lVar3 + 0xd00))(0x8892,lVar7,lVar10,this->m_mapFlags);
  dVar4 = deGetMicroseconds();
  if (dst == (void *)0x0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"MapBufferRange returned NULL","");
    tcu::Exception::Exception(this_00,&local_60);
    __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
  }
  (result->duration).mapDuration = dVar4 - dVar5;
  if (this->m_flushPartial == false) {
    dVar5 = medianTimeMemcpy(dst,(this->
                                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
  }
  else {
    dVar5 = medianTimeMemcpy((void *)((long)dst + (long)(iVar9 >> 2)),
                             (this->
                             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                             ).m_zeroData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
  }
  (result->duration).writeDuration = dVar5;
  local_38 = deGetMicroseconds();
  if (this->m_flushPartial == true) {
    iVar9 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar9 = iVar2;
    }
    lVar7 = (long)(iVar9 >> 2);
    lVar10 = (long)(iVar2 / 2);
  }
  else if (this->m_flushInParts == false) {
    lVar7 = 0;
  }
  else {
    iVar8 = iVar2 / 2;
    iVar9 = iVar2 * 2 + 3;
    if (-1 < iVar2 * 2) {
      iVar9 = iVar2 * 2;
    }
    local_40 = (long)(iVar2 / 3);
    (**(code **)(lVar3 + 0x658))(0x8892,local_40,(long)(iVar8 - iVar2 / 3));
    (**(code **)(lVar3 + 0x658))(0x8892,0,local_40);
    iVar9 = iVar9 >> 2;
    (**(code **)(lVar3 + 0x658))(0x8892,(long)iVar9,(long)(iVar2 - iVar9));
    lVar7 = (long)iVar8;
    lVar10 = (long)(iVar9 - iVar8);
  }
  (**(code **)(lVar3 + 0x658))(0x8892,lVar7,lVar10);
  dVar5 = deGetMicroseconds();
  (result->duration).flushDuration = dVar5 - local_38;
  dVar5 = deGetMicroseconds();
  cVar1 = (**(code **)(lVar3 + 0x1670))(0x8892);
  dVar4 = deGetMicroseconds();
  if (cVar1 == '\0') {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = &PTR__exception_0215a088;
    __cxa_throw(puVar6,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                std::exception::~exception);
  }
  (result->duration).unmapDuration = dVar4 - dVar5;
  dVar5 = (dVar4 - dVar5) + (result->duration).mapDuration + (result->duration).writeDuration +
          (result->duration).flushDuration + (result->duration).allocDuration;
  (result->duration).totalDuration = dVar5;
  (result->duration).fitResponseDuration = dVar5;
  return;
}

Assistant:

void MapBufferRangeFlushCase::testBufferUpload (UploadSampleResult<MapBufferRangeFlushDuration>& result, int bufferSize)
{
	const int unmapFailureThreshold = 4;

	for (; m_unmapFailures < unmapFailureThreshold; ++m_unmapFailures)
	{
		try
		{
			attemptBufferMap(result, bufferSize);
			return;
		}
		catch (UnmapFailureError&)
		{
		}
	}

	throw tcu::TestError("Unmapping failures exceeded limit");
}